

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O3

bool_t ecHasOrderA(word *a,ec_o *ec,word *q,size_t m,void *stack)

{
  bool_t bVar1;
  
  bVar1 = ecMulA((word *)stack,a,ec,q,m,(void *)((long)stack + ec->d * ec->f->n * 8));
  return (bool_t)(bVar1 == 0);
}

Assistant:

bool_t ecHasOrderA(const word a[], const ec_o* ec, const word q[], size_t m,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* b = (word*)stack;
	stack = b + ec->d * n;
	// q a == O?
	return !ecMulA(b, a, ec, q, m, stack);
}